

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linf.c
# Opt level: O0

void linfact(lindef *lin)

{
  int iVar1;
  size_t sVar2;
  char *fullname;
  FILE *pFVar3;
  long in_RDI;
  char *fname;
  
  sVar2 = strlen((char *)(in_RDI + 0x268));
  fullname = (char *)(in_RDI + 0x268) + sVar2 + 1;
  if (*fullname == '\0') {
    sVar2 = strlen((char *)(in_RDI + 0x268));
    iVar1 = dbgu_find_src((char *)(in_RDI + 0x268),(int)sVar2,fullname,0x1000,1);
    if (iVar1 == 0) {
      *(undefined8 *)(in_RDI + 0xd0) = 0;
      return;
    }
  }
  pFVar3 = fopen(fullname,"r");
  *(FILE **)(in_RDI + 0xd0) = pFVar3;
  return;
}

Assistant:

void linfact(lindef *lin)
{
    char   *fname;
#   define  linf ((linfdef *)lin)

    /* get the name buffer, and advance to the full path name portion */
    fname = linf->linfnam;
    fname += strlen(fname) + 1;

    /*
     *   If the full path name is empty, it means that the UI told us to
     *   defer searching for the file until we actually need the file.  At
     *   this point, we actually need the file.  Ask the UI again to find
     *   the file. 
     */
    if (fname[0] != '\0'
        || dbgu_find_src(linf->linfnam, strlen(linf->linfnam),
                         fname, OSFNMAX, TRUE))
    {
        /* open the file */
        linf->linffp = osfoprs(fname, OSFTTEXT);
    }
    else
    {
        /* there's no file to open */
        linf->linffp = 0;
    }

#   undef linf
}